

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<QSslError>::remove(QList<QSslError> *this,char *__filename)

{
  QList<QSslError> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QSslError *in_stack_00000018;
  QMovableArrayOps<QSslError> *in_stack_00000020;
  QArrayDataPointer<QSslError> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QSslError>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QSslError>::operator->(&this->d);
    QArrayDataPointer<QSslError>::operator->(&this->d);
    QArrayDataPointer<QSslError>::begin((QArrayDataPointer<QSslError> *)0x39cd59);
    QtPrivate::QMovableArrayOps<QSslError>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}